

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLMaterialLoader.cpp
# Opt level: O1

void __thiscall
Assimp::MDLImporter::ParseSkinLump_3DGS_MDL7
          (MDLImporter *this,uchar *szCurrent,uchar **szCurrentOut,aiMaterial *pcMatOut,uint iType,
          uint iWidth,uint iHeight)

{
  uint *puVar1;
  _IEEESingle temp;
  aiTexture *paVar2;
  size_t sVar3;
  aiTexture *paVar4;
  Logger *pLVar5;
  aiTexel *paVar6;
  long lVar7;
  size_t sVar8;
  aiTexture **ppaVar9;
  aiScene *paVar10;
  aiTexture **ppaVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  uint iType_00;
  long lVar16;
  char cVar17;
  Material_MDL7 *pcMatIn;
  float *szPos;
  bool bVar18;
  float fVar19;
  int iShadingMode;
  float power;
  int referrer;
  aiTexture *local_480;
  MDLImporter *local_478;
  MDLImporter *local_470;
  aiColor4D local_468;
  uint local_44c;
  char local_448 [8];
  uchar **local_440;
  float local_438;
  undefined1 local_434 [5];
  undefined1 auStack_42f [3];
  float local_42c;
  
  local_480 = (aiTexture *)0x0;
  iType_00 = iType & 0xf;
  local_478 = (MDLImporter *)pcMatOut;
  local_470 = this;
  local_44c = iType;
  if (iType_00 == 7) {
    if (iHeight != 1) {
      pLVar5 = DefaultLogger::get();
      Logger::warn(pLVar5,
                   "Found a reference to an external texture, but texture height is not equal to 1, which is not supported by MED"
                  );
    }
    _local_434 = _local_434 & 0xffffff0000000000;
    memset(local_434 + 5,0x1b,0x3ff);
    sVar3 = strlen((char *)szCurrent);
    sVar8 = 0x400;
    if (sVar3 + 1 < 0x400) {
      sVar8 = sVar3 + 1;
    }
    memcpy(local_434 + 4,szCurrent,sVar8);
    _local_434 = CONCAT44(stack0xfffffffffffffbd0,(int)sVar3);
    this = local_478;
    aiMaterial::AddProperty((aiMaterial *)local_478,(aiString *)local_434,"$tex.file",1,0);
    szCurrent = szCurrent + sVar8;
  }
  else if (iType_00 == 6) {
    if (iHeight != 1) {
      pLVar5 = DefaultLogger::get();
      Logger::warn(pLVar5,
                   "Found a reference to an embedded DDS texture, but texture height is not equal to 1, which is not supported by MED"
                  );
    }
    paVar2 = (aiTexture *)operator_new(0x428);
    paVar2->mWidth = 0;
    paVar2->mHeight = 0;
    paVar2->pcData = (aiTexel *)0x0;
    (paVar2->mFilename).length = 0;
    (paVar2->mFilename).data[0] = '\0';
    memset((paVar2->mFilename).data + 1,0x1b,0x3ff);
    paVar4 = local_480;
    paVar2->achFormatHint[0] = '\0';
    paVar2->achFormatHint[1] = '\0';
    paVar2->achFormatHint[2] = '\0';
    paVar2->achFormatHint[3] = '\0';
    bVar18 = local_480 != (aiTexture *)0x0;
    local_480 = paVar2;
    if (bVar18) {
      std::default_delete<aiTexture>::operator()((default_delete<aiTexture> *)&local_480,paVar4);
    }
    paVar4 = local_480;
    local_480->mHeight = 0;
    local_480->mWidth = iWidth;
    builtin_strncpy(local_480->achFormatHint,"dds",4);
    this = (MDLImporter *)operator_new__((ulong)local_480->mWidth);
    paVar4->pcData = (aiTexel *)this;
    memcpy(this,szCurrent,(ulong)paVar4->mWidth);
    szCurrent = szCurrent + iWidth;
  }
  else if (iType_00 == 1) {
    _local_434 = CONCAT44(stack0xfffffffffffffbd0,iWidth);
    aiMaterial::AddBinaryProperty(pcMatOut,local_434,4,"&&&referrer&&&",0,0,aiPTI_Integer);
    this = (MDLImporter *)pcMatOut;
  }
  else if ((iType == 0 || iType_00 != 0) || (iHeight != 0 && iWidth != 0)) {
    paVar4 = (aiTexture *)operator_new(0x428);
    paVar4->mWidth = 0;
    paVar4->mHeight = 0;
    paVar4->pcData = (aiTexel *)0x0;
    (paVar4->mFilename).length = 0;
    (paVar4->mFilename).data[0] = '\0';
    local_440 = szCurrentOut;
    memset((paVar4->mFilename).data + 1,0x1b,0x3ff);
    paVar4->achFormatHint[0] = '\0';
    paVar4->achFormatHint[1] = '\0';
    paVar4->achFormatHint[2] = '\0';
    paVar4->achFormatHint[3] = '\0';
    local_480 = paVar4;
    if (iWidth == 0 || iHeight == 0) {
      pLVar5 = DefaultLogger::get();
      szCurrentOut = local_440;
      Logger::warn(pLVar5,
                   "Found embedded texture, but its width an height are both 0. Is this a joke?");
      local_480->mHeight = 8;
      local_480->mWidth = 8;
      paVar6 = (aiTexel *)operator_new__(0x100);
      local_480->pcData = paVar6;
      lVar7 = 3;
      lVar12 = 0;
      do {
        lVar16 = 0;
        lVar14 = lVar7;
        do {
          uVar13 = (ulong)((uint)lVar12 ^ (uint)lVar16) & 0xffffffffffffff01;
          cVar17 = -(char)uVar13;
          this = (MDLImporter *)CONCAT71((int7)(uVar13 >> 8),cVar17);
          paVar6 = local_480->pcData;
          *(char *)((long)paVar6 + lVar14 + -2) = cVar17;
          *(char *)((long)paVar6 + lVar14 + -3) = cVar17;
          *(char *)((long)paVar6 + lVar14 + -1) = cVar17;
          (&paVar6->b)[lVar14] = 0xff;
          lVar16 = lVar16 + 1;
          lVar14 = lVar14 + 0x20;
        } while (lVar16 != 8);
        lVar12 = lVar12 + 1;
        lVar7 = lVar7 + 4;
      } while (lVar12 != 8);
    }
    else {
      paVar4->mWidth = iWidth;
      paVar4->mHeight = iHeight;
      _local_434 = _local_434 & 0xffffffff00000000;
      this = local_470;
      ParseTextureColorData(local_470,szCurrent,iType_00,(uint *)local_434,paVar4);
      szCurrent = szCurrent + (_local_434 & 0xffffffff);
      szCurrentOut = local_440;
    }
  }
  local_468 = (aiColor4D)ZEXT816(0);
  if (local_480 == (aiTexture *)0x0) {
    local_468.r = NAN;
  }
  else {
    local_468 = ReplaceTextureWithColor(this,local_480);
  }
  if ((local_44c & 0x10) == 0) {
    szPos = (float *)szCurrent;
    if ((~(uint)local_468.r & 0x7f800000) != 0 ||
        ((undefined1  [16])local_468 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      aiMaterial::AddBinaryProperty
                ((aiMaterial *)local_478,&local_468,0x10,"$clr.diffuse",0,0,aiPTI_Float);
      aiMaterial::AddBinaryProperty
                ((aiMaterial *)local_478,&local_468,0x10,"$clr.specular",0,0,aiPTI_Float);
    }
  }
  else {
    szPos = (float *)((long)szCurrent + 0x44);
    SizeCheck(local_470,szPos,
              "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/MDL/MDLMaterialLoader.cpp"
              ,0x25b);
    _local_434 = *(ulong *)szCurrent;
    local_42c = *(float *)((long)szCurrent + 8);
    if ((~(uint)local_468.r & 0x7f800000) != 0 ||
        ((undefined1  [16])local_468 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      stack0xfffffffffffffbd0 = *(float *)((long)szCurrent + 4) * local_468.g;
      local_434._0_4_ = *(float *)szCurrent * local_468.r;
      local_42c = local_42c * local_468.b;
    }
    aiMaterial::AddBinaryProperty
              ((aiMaterial *)local_478,local_434,0xc,"$clr.diffuse",0,0,aiPTI_Float);
    _local_434 = *(ulong *)((long)szCurrent + 0x20);
    local_42c = *(float *)((long)szCurrent + 0x28);
    if ((~(uint)local_468.r & 0x7f800000) != 0 ||
        ((undefined1  [16])local_468 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      stack0xfffffffffffffbd0 = *(float *)((long)szCurrent + 0x24) * local_468.g;
      local_434._0_4_ = *(float *)((long)szCurrent + 0x20) * local_468.r;
      local_42c = local_42c * local_468.b;
    }
    aiMaterial::AddBinaryProperty
              ((aiMaterial *)local_478,local_434,0xc,"$clr.specular",0,0,aiPTI_Float);
    _local_434 = *(ulong *)((long)szCurrent + 0x10);
    local_42c = *(float *)((long)szCurrent + 0x18);
    if ((~(uint)local_468.r & 0x7f800000) != 0 ||
        ((undefined1  [16])local_468 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      stack0xfffffffffffffbd0 = *(float *)((long)szCurrent + 0x14) * local_468.g;
      local_434._0_4_ = *(float *)((long)szCurrent + 0x10) * local_468.r;
      local_42c = local_42c * local_468.b;
    }
    aiMaterial::AddBinaryProperty
              ((aiMaterial *)local_478,local_434,0xc,"$clr.ambient",0,0,aiPTI_Float);
    local_434._0_4_ = *(float *)((long)szCurrent + 0x30);
    unique0x00006b00 = *(float *)((long)szCurrent + 0x34);
    local_42c = *(float *)((long)szCurrent + 0x38);
    aiMaterial::AddBinaryProperty
              ((aiMaterial *)local_478,local_434,0xc,"$clr.emissive",0,0,aiPTI_Float);
    fVar19 = *(float *)((long)szCurrent + 0x1c);
    if ((~(uint)local_468.r & 0x7f800000) != 0 ||
        ((undefined1  [16])local_468 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar19 = fVar19 * local_468.a;
    }
    _local_434 = CONCAT44(stack0xfffffffffffffbd0,fVar19);
    aiMaterial::AddBinaryProperty
              ((aiMaterial *)local_478,local_434,4,"$mat.opacity",0,0,aiPTI_Float);
    local_448[0] = '\x02';
    local_448[1] = '\0';
    local_448[2] = '\0';
    local_448[3] = '\0';
    fVar19 = *(float *)((long)szCurrent + 0x40);
    if ((fVar19 != 0.0) || (NAN(fVar19))) {
      local_448[0] = '\x03';
      local_448[1] = '\0';
      local_448[2] = '\0';
      local_448[3] = '\0';
      local_438 = fVar19;
      aiMaterial::AddBinaryProperty
                ((aiMaterial *)local_478,&local_438,4,"$mat.shininess",0,0,aiPTI_Float);
    }
    aiMaterial::AddBinaryProperty
              ((aiMaterial *)local_478,local_448,4,"$mat.shadingm",0,0,aiPTI_Integer);
  }
  paVar4 = local_480;
  if ((~(uint)local_468.r & 0x7f800000) != 0 ||
      ((undefined1  [16])local_468 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
    local_480 = (aiTexture *)0x0;
    if (paVar4 != (aiTexture *)0x0) {
      std::default_delete<aiTexture>::operator()((default_delete<aiTexture> *)&local_480,paVar4);
    }
  }
  if ((local_44c & 0x20) != 0) {
    SizeCheck(local_470,szPos,
              "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/MDL/MDLMaterialLoader.cpp"
              ,0x2b6);
    szPos = (float *)((long)szPos + (long)(int)*szPos + 4);
    SizeCheck(local_470,szPos,
              "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/MDL/MDLMaterialLoader.cpp"
              ,0x2ba);
  }
  if ((local_480 != (aiTexture *)0x0) && (local_470->pScene->mNumTextures < 1000)) {
    snprintf(local_448,5,"*%i");
    _local_434 = _local_434 & 0xffffff0000000000;
    memset(local_434 + 5,0x1b,0x3ff);
    sVar8 = strlen(local_448);
    memcpy(local_434 + 4,local_448,sVar8 + 1);
    _local_434 = CONCAT44(stack0xfffffffffffffbd0,(int)sVar8);
    aiMaterial::AddProperty((aiMaterial *)local_478,(aiString *)local_434,"$tex.file",1,0);
    paVar10 = local_470->pScene;
    if (paVar10->mNumTextures == 0) {
      paVar10->mNumTextures = 1;
      ppaVar11 = (aiTexture **)operator_new__(8);
      paVar4 = local_480;
      local_470->pScene->mTextures = ppaVar11;
      local_480 = (aiTexture *)0x0;
      *local_470->pScene->mTextures = paVar4;
    }
    else {
      ppaVar11 = paVar10->mTextures;
      ppaVar9 = (aiTexture **)operator_new__((ulong)(paVar10->mNumTextures + 1) << 3);
      paVar4 = local_480;
      paVar10->mTextures = ppaVar9;
      paVar10 = local_470->pScene;
      uVar13 = (ulong)paVar10->mNumTextures;
      if (paVar10->mNumTextures != 0) {
        uVar15 = 0;
        do {
          paVar10->mTextures[uVar15] = ppaVar11[uVar15];
          uVar15 = uVar15 + 1;
          paVar10 = local_470->pScene;
          uVar13 = (ulong)paVar10->mNumTextures;
        } while (uVar15 < uVar13);
      }
      local_480 = (aiTexture *)0x0;
      paVar10->mTextures[uVar13] = paVar4;
      puVar1 = &local_470->pScene->mNumTextures;
      *puVar1 = *puVar1 + 1;
      if (ppaVar11 != (aiTexture **)0x0) {
        operator_delete__(ppaVar11);
      }
    }
  }
  SizeCheck(local_470,szPos,
            "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/MDL/MDLMaterialLoader.cpp"
            ,0x2e1);
  *szCurrentOut = (uchar *)szPos;
  if (local_480 != (aiTexture *)0x0) {
    std::default_delete<aiTexture>::operator()((default_delete<aiTexture> *)&local_480,local_480);
  }
  return;
}

Assistant:

void MDLImporter::ParseSkinLump_3DGS_MDL7(
    const unsigned char* szCurrent,
    const unsigned char** szCurrentOut,
    aiMaterial* pcMatOut,
    unsigned int iType,
    unsigned int iWidth,
    unsigned int iHeight)
{
    std::unique_ptr<aiTexture> pcNew;

    // get the type of the skin
    unsigned int iMasked = (unsigned int)(iType & 0xF);

    if (0x1 ==  iMasked)
    {
        // ***** REFERENCE TO ANOTHER SKIN INDEX *****
        int referrer = (int)iWidth;
        pcMatOut->AddProperty<int>(&referrer,1,AI_MDL7_REFERRER_MATERIAL);
    }
    else if (0x6 == iMasked)
    {
        // ***** EMBEDDED DDS FILE *****
        if (1 != iHeight)
        {
            ASSIMP_LOG_WARN("Found a reference to an embedded DDS texture, "
                "but texture height is not equal to 1, which is not supported by MED");
        }

        pcNew.reset(new aiTexture());
        pcNew->mHeight = 0;
        pcNew->mWidth = iWidth;

        // place a proper format hint
        pcNew->achFormatHint[0] = 'd';
        pcNew->achFormatHint[1] = 'd';
        pcNew->achFormatHint[2] = 's';
        pcNew->achFormatHint[3] = '\0';

        pcNew->pcData = (aiTexel*) new unsigned char[pcNew->mWidth];
        memcpy(pcNew->pcData,szCurrent,pcNew->mWidth);
        szCurrent += iWidth;
    }
    else if (0x7 == iMasked)
    {
        // ***** REFERENCE TO EXTERNAL FILE *****
        if (1 != iHeight)
        {
            ASSIMP_LOG_WARN("Found a reference to an external texture, "
                "but texture height is not equal to 1, which is not supported by MED");
        }

        aiString szFile;
        const size_t iLen = strlen((const char*)szCurrent);
        size_t iLen2 = iLen+1;
        iLen2 = iLen2 > MAXLEN ? MAXLEN : iLen2;
        memcpy(szFile.data,(const char*)szCurrent,iLen2);
        szFile.length = iLen;

        szCurrent += iLen2;

        // place this as diffuse texture
        pcMatOut->AddProperty(&szFile,AI_MATKEY_TEXTURE_DIFFUSE(0));
    }
    else if (iMasked || !iType || (iType && iWidth && iHeight))
    {
        pcNew.reset(new aiTexture());
        if (!iHeight || !iWidth)
        {
            ASSIMP_LOG_WARN("Found embedded texture, but its width "
                "an height are both 0. Is this a joke?");

            // generate an empty chess pattern
            pcNew->mWidth = pcNew->mHeight = 8;
            pcNew->pcData = new aiTexel[64];
            for (unsigned int x = 0; x < 8;++x)
            {
                for (unsigned int y = 0; y < 8;++y)
                {
                    const bool bSet = ((0 == x % 2 && 0 != y % 2) ||
                        (0 != x % 2 && 0 == y % 2));

                    aiTexel* pc = &pcNew->pcData[y * 8 + x];
                    pc->r = pc->b = pc->g = (bSet?0xFF:0);
                    pc->a = 0xFF;
                }
            }
        }
        else
        {
            // it is a standard color texture. Fill in width and height
            // and call the same function we used for loading MDL5 files

            pcNew->mWidth = iWidth;
            pcNew->mHeight = iHeight;

            unsigned int iSkip = 0;
            ParseTextureColorData(szCurrent,iMasked,&iSkip,pcNew.get());

            // skip length of texture data
            szCurrent += iSkip;
        }
    }

    // sometimes there are MDL7 files which have a monochrome
    // texture instead of material colors ... posssible they have
    // been converted to MDL7 from other formats, such as MDL5
    aiColor4D clrTexture;
    if (pcNew)clrTexture = ReplaceTextureWithColor(pcNew.get());
    else clrTexture.r = get_qnan();

    // check whether a material definition is contained in the skin
    if (iType & AI_MDL7_SKINTYPE_MATERIAL)
    {
        BE_NCONST MDL::Material_MDL7* pcMatIn = (BE_NCONST MDL::Material_MDL7*)szCurrent;
        szCurrent = (unsigned char*)(pcMatIn+1);
        VALIDATE_FILE_SIZE(szCurrent);

        aiColor3D clrTemp;

#define COLOR_MULTIPLY_RGB() \
    if (is_not_qnan(clrTexture.r)) \
        { \
        clrTemp.r *= clrTexture.r; \
        clrTemp.g *= clrTexture.g; \
        clrTemp.b *= clrTexture.b; \
        }

        // read diffuse color
        clrTemp.r = pcMatIn->Diffuse.r;
        AI_SWAP4(clrTemp.r);
        clrTemp.g = pcMatIn->Diffuse.g;
        AI_SWAP4(clrTemp.g);
        clrTemp.b = pcMatIn->Diffuse.b;
        AI_SWAP4(clrTemp.b);
        COLOR_MULTIPLY_RGB();
        pcMatOut->AddProperty<aiColor3D>(&clrTemp,1,AI_MATKEY_COLOR_DIFFUSE);

        // read specular color
        clrTemp.r = pcMatIn->Specular.r;
        AI_SWAP4(clrTemp.r);
        clrTemp.g = pcMatIn->Specular.g;
        AI_SWAP4(clrTemp.g);
        clrTemp.b = pcMatIn->Specular.b;
        AI_SWAP4(clrTemp.b);
        COLOR_MULTIPLY_RGB();
        pcMatOut->AddProperty<aiColor3D>(&clrTemp,1,AI_MATKEY_COLOR_SPECULAR);

        // read ambient color
        clrTemp.r = pcMatIn->Ambient.r;
        AI_SWAP4(clrTemp.r);
        clrTemp.g = pcMatIn->Ambient.g;
        AI_SWAP4(clrTemp.g);
        clrTemp.b = pcMatIn->Ambient.b;
        AI_SWAP4(clrTemp.b);
        COLOR_MULTIPLY_RGB();
        pcMatOut->AddProperty<aiColor3D>(&clrTemp,1,AI_MATKEY_COLOR_AMBIENT);

        // read emissive color
        clrTemp.r = pcMatIn->Emissive.r;
        AI_SWAP4(clrTemp.r);
        clrTemp.g = pcMatIn->Emissive.g;
        AI_SWAP4(clrTemp.g);
        clrTemp.b = pcMatIn->Emissive.b;
        AI_SWAP4(clrTemp.b);
        pcMatOut->AddProperty<aiColor3D>(&clrTemp,1,AI_MATKEY_COLOR_EMISSIVE);

#undef COLOR_MULITPLY_RGB

        // FIX: Take the opacity from the ambient color.
        // The doc say something else, but it is fact that MED exports the
        // opacity like this .... oh well.
        clrTemp.r = pcMatIn->Ambient.a;
        AI_SWAP4(clrTemp.r);
        if (is_not_qnan(clrTexture.r)) {
            clrTemp.r *= clrTexture.a;
        }
        pcMatOut->AddProperty<ai_real>(&clrTemp.r,1,AI_MATKEY_OPACITY);

        // read phong power
        int iShadingMode = (int)aiShadingMode_Gouraud;
        AI_SWAP4(pcMatIn->Power);
        if (0.0f != pcMatIn->Power)
        {
            iShadingMode = (int)aiShadingMode_Phong;
            // pcMatIn is packed, we can't form pointers to its members
            float power = pcMatIn->Power;
            pcMatOut->AddProperty<float>(&power,1,AI_MATKEY_SHININESS);
        }
        pcMatOut->AddProperty<int>(&iShadingMode,1,AI_MATKEY_SHADING_MODEL);
    }
    else if (is_not_qnan(clrTexture.r))
    {
        pcMatOut->AddProperty<aiColor4D>(&clrTexture,1,AI_MATKEY_COLOR_DIFFUSE);
        pcMatOut->AddProperty<aiColor4D>(&clrTexture,1,AI_MATKEY_COLOR_SPECULAR);
    }
    // if the texture could be replaced by a single material color
    // we don't need the texture anymore
    if (is_not_qnan(clrTexture.r))
    {
        pcNew.reset();
    }

    // If an ASCII effect description (HLSL?) is contained in the file,
    // we can simply ignore it ...
    if (iType & AI_MDL7_SKINTYPE_MATERIAL_ASCDEF)
    {
        VALIDATE_FILE_SIZE(szCurrent);
        int32_t iMe = *((int32_t*)szCurrent);
        AI_SWAP4(iMe);
        szCurrent += sizeof(char) * iMe + sizeof(int32_t);
        VALIDATE_FILE_SIZE(szCurrent);
    }

    // If an embedded texture has been loaded setup the corresponding
    // data structures in the aiScene instance
    if (pcNew && pScene->mNumTextures <= 999)
    {

        // place this as diffuse texture
        char szCurrent[5];
        ai_snprintf(szCurrent,5,"*%i",this->pScene->mNumTextures);

        aiString szFile;
        const size_t iLen = strlen((const char*)szCurrent);
        ::memcpy(szFile.data,(const char*)szCurrent,iLen+1);
        szFile.length = iLen;

        pcMatOut->AddProperty(&szFile,AI_MATKEY_TEXTURE_DIFFUSE(0));

        // store the texture
        if (!pScene->mNumTextures)
        {
            pScene->mNumTextures = 1;
            pScene->mTextures = new aiTexture*[1];
            pScene->mTextures[0] = pcNew.release();
        }
        else
        {
            aiTexture** pc = pScene->mTextures;
            pScene->mTextures = new aiTexture*[pScene->mNumTextures+1];
            for (unsigned int i = 0; i < pScene->mNumTextures;++i) {
                pScene->mTextures[i] = pc[i];
            }

            pScene->mTextures[pScene->mNumTextures] = pcNew.release();
            pScene->mNumTextures++;
            delete[] pc;
        }
    }
    VALIDATE_FILE_SIZE(szCurrent);
    *szCurrentOut = szCurrent;
}